

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# func.h
# Opt level: O0

void __thiscall GF2::BFunc<8UL>::FWHT(BFunc<8UL> *this,Func<8UL,_int> *zfRight)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  word wVar4;
  int *piVar5;
  byte bVar6;
  Func<8UL,_int> *in_RSI;
  Func<8UL,_bool> *in_RDI;
  int t;
  word k;
  word j;
  word i;
  Preimage x;
  Func<8UL,_int> *this_00;
  undefined4 in_stack_ffffffffffffffb8;
  ulong local_30;
  ulong local_28;
  ulong local_20;
  WW local_18 [8];
  Func<8UL,_int> *local_10;
  
  local_10 = in_RSI;
  WW<8UL>::WW((WW<8UL> *)0x1bcc42);
  do {
    wVar4 = GF2::WW::operator_cast_to_unsigned_long(local_18);
    bVar2 = Func<8UL,_bool>::Get(in_RDI,wVar4);
    iVar3 = -1;
    if (bVar2) {
      iVar3 = 1;
    }
    this_00 = local_10;
    wVar4 = GF2::WW::operator_cast_to_unsigned_long(local_18);
    piVar5 = Func<8UL,_int>::operator[](this_00,wVar4);
    *piVar5 = iVar3;
    bVar2 = WW<8UL>::Next((WW<8UL> *)CONCAT44(iVar3,in_stack_ffffffffffffffb8),
                          SUB81((ulong)this_00 >> 0x38,0));
  } while (bVar2);
  for (local_20 = 0; local_20 < 8; local_20 = local_20 + 1) {
    for (local_28 = 0; local_28 < 0x100; local_28 = (1L << (bVar6 + 1 & 0x3f)) + local_28) {
      for (local_30 = 0; bVar6 = (byte)local_20, local_30 < (ulong)(1L << (bVar6 & 0x3f));
          local_30 = local_30 + 1) {
        piVar5 = Func<8UL,_int>::operator[](local_10,local_28 + local_30);
        iVar3 = *piVar5;
        piVar5 = Func<8UL,_int>::operator[](local_10,local_28 + local_30 + (1L << (bVar6 & 0x3f)));
        iVar1 = *piVar5;
        piVar5 = Func<8UL,_int>::operator[](local_10,local_28 + local_30);
        *piVar5 = iVar1 + *piVar5;
        piVar5 = Func<8UL,_int>::operator[](local_10,local_28 + local_30 + (1L << (bVar6 & 0x3f)));
        iVar1 = *piVar5;
        piVar5 = Func<8UL,_int>::operator[](local_10,local_28 + local_30 + (1L << (bVar6 & 0x3f)));
        *piVar5 = iVar3 - iVar1;
      }
    }
  }
  return;
}

Assistant:

void FWHT(Func<_n, int>& zfRight) const
	{	
		Preimage x;
		// zfRight <- (-1)^this
		do 
			zfRight[x] = Get(x) ? 1 : -1;
		while (x.Next());
		// zf <- FWHT(zf)
		for (word i = 0; i < _n; ++i)
		for (word j = 0; j < _size; j += WORD_1 << (i + 1))
		for (word k = 0; k < WORD_1 << i; ++k)
		{
			int t = zfRight[j + k];
			zfRight[j + k] += zfRight[j + k + (WORD_1 << i)];
			zfRight[j + k + (WORD_1 << i)] = 
				t - zfRight[j + k + (WORD_1 << i)];
		}
	}